

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O2

int scv_shrink_to_fit(scv_vector *v)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  size_t __size;
  
  if (v == (scv_vector *)0x0) {
    __assert_fail("v != NULL","/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c"
                  ,0x108,"int scv_shrink_to_fit(struct scv_vector *)");
  }
  if (v->data == (void *)0x0) {
    __assert_fail("v->data != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x109,
                  "int scv_shrink_to_fit(struct scv_vector *)");
  }
  uVar3 = v->size;
  iVar2 = 0;
  if (v->capacity != uVar3) {
    uVar1 = v->objsize;
    if (uVar1 == 0) {
      __assert_fail("v->objsize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x111,
                    "int scv_shrink_to_fit(struct scv_vector *)");
    }
    if (0xffffffffffffffff / uVar1 <= uVar3) {
      __assert_fail("newcapacity < (size_t) -1 / v->objsize",
                    "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x112,
                    "int scv_shrink_to_fit(struct scv_vector *)");
    }
    __size = uVar1 * uVar3;
    if (__size < 0x40) {
      uVar3 = (uVar1 + 0x3f) / uVar1;
      __size = uVar3 * uVar1;
    }
    pvVar4 = realloc(v->data,__size);
    if (pvVar4 == (void *)0x0) {
      iVar2 = -2;
    }
    else {
      v->data = pvVar4;
      v->capacity = uVar3;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int scv_shrink_to_fit(struct scv_vector *v)
{
	void *newdata;
	size_t newcapacity;

	assert(v != NULL);
	assert(v->data != NULL);

	if (v->capacity == v->size) {
		return SCV_OK;
	}

	newcapacity = v->size;

	assert(v->objsize > 0);
	assert(newcapacity < (size_t) -1 / v->objsize);

	/* Minimum capacity is SCV_MIN_ALLOC bytes or 1 element */
	if (newcapacity * v->objsize < SCV_MIN_ALLOC) {
		newcapacity = (SCV_MIN_ALLOC + (v->objsize - 1)) / v->objsize;
	}

	newdata = realloc(v->data, newcapacity * v->objsize);

	if (newdata == NULL) {
		return SCV_ENOMEM;
	}

	v->data = newdata;
	v->capacity = newcapacity;

	return SCV_OK;
}